

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O1

void readTiledRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  Box2i *pBVar3;
  Rgba *pRVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  TiledRgbaInputFile in;
  TiledRgbaInputFile local_68;
  
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile(&local_68,fileName,iVar1);
  pBVar3 = Imf_2_5::TiledRgbaInputFile::dataWindow(&local_68);
  iVar1 = (pBVar3->min).x;
  lVar6 = (long)(pBVar3->min).y;
  iVar2 = (pBVar3->max).y;
  *width = ((pBVar3->max).x - iVar1) + 1;
  lVar7 = (iVar2 - lVar6) + 1;
  *height = (int)lVar7;
  lVar5 = (long)*width;
  pRVar4 = (Rgba *)operator_new__(-(ulong)((ulong)(lVar5 * lVar7) >> 0x3d != 0) | lVar5 * lVar7 * 8)
  ;
  if (pixels->_data != (Rgba *)0x0) {
    operator_delete__(pixels->_data);
  }
  pixels->_sizeX = lVar7;
  pixels->_sizeY = lVar5;
  pixels->_data = pRVar4;
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            (&local_68,pRVar4 + -lVar6 * lVar5 + (long)-iVar1,1,(long)*width);
  iVar1 = Imf_2_5::TiledRgbaInputFile::numXTiles(&local_68,0);
  iVar2 = Imf_2_5::TiledRgbaInputFile::numYTiles(&local_68,0);
  Imf_2_5::TiledRgbaInputFile::readTiles(&local_68,0,iVar1 + -1,0,iVar2 + -1,0);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile(&local_68);
  return;
}

Assistant:

void
readTiledRgba1 (const char fileName[],
                Array2D<Rgba> &pixels,
                int &width,
                int &height)
{
    TiledRgbaInputFile in (fileName);
    Box2i dw = in.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
}